

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpolygon.cpp
# Opt level: O0

void __thiscall QPolygon::point(QPolygon *this,int index,int *x,int *y)

{
  long lVar1;
  int iVar2;
  QList<QPoint> *in_RCX;
  int *in_RDX;
  long in_FS_OFFSET;
  QPoint p;
  qsizetype in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QPoint>::at(in_RCX,in_stack_ffffffffffffffc8);
  if (in_RDX != (int *)0x0) {
    iVar2 = QPoint::x((QPoint *)0x641fee);
    *in_RDX = iVar2;
  }
  if (in_RCX != (QList<QPoint> *)0x0) {
    iVar2 = QPoint::y((QPoint *)0x642009);
    *(int *)&(in_RCX->d).d = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPolygon::point(int index, int *x, int *y) const
{
    QPoint p = at(index);
    if (x)
        *x = (int)p.x();
    if (y)
        *y = (int)p.y();
}